

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perlin.h
# Opt level: O1

double __thiscall perlin::noise(perlin *this,point3 *p)

{
  double *pdVar1;
  double dVar2;
  double __x;
  double __x_00;
  uint uVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  uint uVar9;
  vec3 *pvVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  vec3 *__s;
  long lVar14;
  bool bVar15;
  vec3 c [2] [2] [2];
  vec3 local_f8 [8];
  
  dVar2 = p->e[0];
  __x = p->e[1];
  __x_00 = p->e[2];
  dVar5 = floor(dVar2);
  dVar6 = floor(__x);
  dVar7 = floor(__x_00);
  __s = local_f8;
  memset(__s,0,0xc0);
  lVar14 = 0;
  do {
    uVar3 = this->perm_x[(int)lVar14 + (int)dVar5 & 0xff];
    pvVar10 = __s;
    lVar11 = 0;
    do {
      uVar4 = this->perm_y[(int)lVar11 + (int)dVar6 & 0xff];
      lVar12 = 0;
      uVar13 = (int)dVar7;
      do {
        uVar9 = this->perm_z[uVar13 & 0xff] ^ uVar4 ^ uVar3;
        *(double *)((long)pvVar10->e + lVar12 + 0x10) = this->randvec[(int)uVar9].e[2];
        dVar8 = this->randvec[(int)uVar9].e[1];
        pdVar1 = (double *)((long)pvVar10->e + lVar12);
        *pdVar1 = this->randvec[(int)uVar9].e[0];
        pdVar1[1] = dVar8;
        uVar13 = uVar13 + 1;
        lVar12 = lVar12 + 0x18;
      } while (lVar12 == 0x18);
      pvVar10 = pvVar10 + 2;
      bVar15 = lVar11 == 0;
      lVar11 = lVar11 + 1;
    } while (bVar15);
    __s = __s + 4;
    bVar15 = lVar14 == 0;
    lVar14 = lVar14 + 1;
  } while (bVar15);
  dVar2 = perlin_interp((vec3 (*) [2] [2])local_f8,dVar2 - dVar5,__x - dVar6,__x_00 - dVar7);
  return dVar2;
}

Assistant:

double noise(const point3& p) const {
        auto u = p.x() - std::floor(p.x());
        auto v = p.y() - std::floor(p.y());
        auto w = p.z() - std::floor(p.z());

        auto i = int(std::floor(p.x()));
        auto j = int(std::floor(p.y()));
        auto k = int(std::floor(p.z()));
        vec3 c[2][2][2];

        for (int di=0; di < 2; di++)
            for (int dj=0; dj < 2; dj++)
                for (int dk=0; dk < 2; dk++)
                    c[di][dj][dk] = randvec[
                        perm_x[(i+di) & 255] ^
                        perm_y[(j+dj) & 255] ^
                        perm_z[(k+dk) & 255]
                    ];

        return perlin_interp(c, u, v, w);
    }